

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::f_equals0(Forth *this)

{
  double dVar1;
  uint local_2c;
  double n2;
  Forth *this_local;
  
  requireDStackAvailable(this,1,"F0=");
  requireFStackDepth(this,1,"F0=");
  dVar1 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    local_2c = this->False;
  }
  else {
    local_2c = this->True;
  }
  ForthStack<unsigned_int>::push(&this->dStack,local_2c);
  return;
}

Assistant:

void f_equals0() {
			REQUIRE_DSTACK_AVAILABLE(1, "F0=");
			REQUIRE_FSTACK_DEPTH(1, "F0=");
			auto n2 = fStack.getTop(); fStack.pop();
			dStack.push(0.0 == n2 ? True : False);
		}